

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

result * __thiscall
lest::expression_lhs<std::optional<long>const&>::operator>
          (result *__return_storage_ptr__,expression_lhs<std::optional<long>const&> *this,
          optional<char> *rhs)

{
  lest *this_00;
  optional<char> *in_R8;
  allocator<char> local_69;
  optional<long> local_68 [2];
  string local_48;
  bool local_21;
  string *local_20;
  optional<char> *rhs_local;
  expression_lhs<const_std::optional<long>_&> *this_local;
  
  local_20 = (string *)rhs;
  rhs_local = (optional<char> *)this;
  this_local = (expression_lhs<const_std::optional<long>_&> *)__return_storage_ptr__;
  local_21 = std::operator>(*(optional<long> **)this,rhs);
  this_00 = *(lest **)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68,">",&local_69);
  to_string<std::optional<long>,std::optional<char>>(&local_48,this_00,local_68,local_20,in_R8);
  result::result<bool>(__return_storage_ptr__,&local_21,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)local_68);
  std::allocator<char>::~allocator(&local_69);
  return __return_storage_ptr__;
}

Assistant:

result operator<=( R const & rhs ) { return result( lhs <= rhs, to_string( lhs, "<=", rhs ) ); }